

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeAdvancedBlend(FragmentProcessor *this,BlendEquationAdvanced equation)

{
  float fVar1;
  int i;
  long lVar2;
  long lVar3;
  Vec3 *pVVar4;
  SampleData *sample;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vec3 dstColor;
  Vec3 srcColor;
  undefined8 local_80;
  float local_78;
  float local_70;
  float local_6c;
  float local_68 [4];
  Vec3 local_58;
  Vec3 local_4c;
  advblend local_40 [12];
  float local_34;
  
  lVar2 = 0;
  do {
    if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) ==
        '\x01') {
      fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + 0xc)
      ;
      fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar2 + 0xc);
      fVar8 = (1.0 - fVar9) * fVar15;
      fVar10 = (1.0 - fVar15) * fVar9;
      fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar2 + 4);
      fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + 4);
      fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar2 + 8);
      fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + 8);
      *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2) =
           *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2) * fVar8 +
           *(float *)((long)this->m_sampleRegister[0].clampedBlendDstColor.m_data + lVar2) * fVar10;
      *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2 + 4) =
           fVar13 * fVar8 + fVar11 * fVar10;
      *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar2 + 8) =
           fVar14 * fVar8 + fVar12 * fVar10;
      *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar2 + -4) =
           fVar15 * fVar9;
      *(float *)((long)this->m_sampleRegister[0].signedValue.m_data + lVar2 + -4) =
           fVar8 + fVar15 * fVar9 + fVar10;
    }
    lVar2 = lVar2 + 0x84;
  } while (lVar2 != 0x2100);
  switch(equation) {
  case BLENDEQUATION_ADVANCED_MULTIPLY:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x58);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x54);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        fVar8 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x5c)
             * *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                         lVar2 + -0x3c) * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar9 * fVar11 * fVar15 + fVar13;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar12 * fVar14 * fVar15 + fVar8;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_SCREEN:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar8 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x54);
        fVar10 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             ((fVar11 + fVar9) - fVar11 * fVar9) * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             ((fVar13 + fVar12) - fVar13 * fVar12) * fVar15 + fVar14;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             ((fVar8 + fVar10) - fVar8 * fVar10) * fVar15 + fVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_OVERLAY:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        if (fVar9 <= 0.5) {
          fVar9 = (fVar15 + fVar15) * fVar9;
        }
        else {
          fVar9 = (1.0 - fVar15) * -2.0 * (1.0 - fVar9) + 1.0;
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        if (fVar11 <= 0.5) {
          fVar11 = (fVar15 + fVar15) * fVar11;
        }
        else {
          fVar11 = (1.0 - fVar15) * -2.0 * (1.0 - fVar11) + 1.0;
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x54);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        if (fVar13 <= 0.5) {
          fVar13 = (fVar15 + fVar15) * fVar13;
        }
        else {
          fVar13 = (1.0 - fVar15) * -2.0 * (1.0 - fVar13) + 1.0;
        }
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar9 * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar11 * fVar15 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar13 * fVar15 + fVar14;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_DARKEN:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        uVar5 = -(uint)(fVar11 <= fVar9);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        uVar6 = -(uint)(fVar13 <= fVar12);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar8 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x54);
        fVar10 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        uVar7 = -(uint)(fVar8 <= fVar10);
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             (float)(~uVar5 & (uint)fVar9 | (uint)fVar11 & uVar5) * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             (float)(~uVar6 & (uint)fVar12 | (uint)fVar13 & uVar6) * fVar15 + fVar14;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             (float)(~uVar7 & (uint)fVar10 | (uint)fVar8 & uVar7) * fVar15 + fVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_LIGHTEN:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        uVar5 = -(uint)(fVar9 <= fVar11);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        uVar6 = -(uint)(fVar12 <= fVar13);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar8 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x54);
        fVar10 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        uVar7 = -(uint)(fVar10 <= fVar8);
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             (float)(~uVar5 & (uint)fVar9 | (uint)fVar11 & uVar5) * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             (float)(~uVar6 & (uint)fVar12 | (uint)fVar13 & uVar6) * fVar15 + fVar14;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             (float)(~uVar7 & (uint)fVar10 | (uint)fVar8 & uVar7) * fVar15 + fVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_COLORDODGE:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x3c);
        fVar9 = 0.0;
        if ((0.0 < fVar15) &&
           (fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                               lVar2 + -0x5c), fVar9 = 1.0, fVar11 < 1.0)) {
          fVar15 = fVar15 / (1.0 - fVar11);
          fVar9 = 1.0;
          if (fVar15 <= 1.0) {
            fVar9 = fVar15;
          }
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        fVar11 = 0.0;
        if (0.0 < fVar15) {
          fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x58);
          fVar11 = 1.0;
          if (fVar13 < 1.0) {
            fVar15 = fVar15 / (1.0 - fVar13);
            fVar11 = 1.0;
            if (fVar15 <= 1.0) {
              fVar11 = fVar15;
            }
          }
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        fVar13 = 0.0;
        if ((0.0 < fVar15) &&
           (fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                               lVar2 + -0x54), fVar13 = 1.0, fVar12 < 1.0)) {
          fVar15 = fVar15 / (1.0 - fVar12);
          fVar13 = 1.0;
          if (fVar15 <= 1.0) {
            fVar13 = fVar15;
          }
        }
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar9 * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar11 * fVar15 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar13 * fVar15 + fVar14;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_COLORBURN:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x3c);
        fVar9 = 1.0;
        if (fVar15 < 1.0) {
          fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x5c);
          fVar9 = 0.0;
          if (0.0 < fVar11) {
            fVar11 = (1.0 - fVar15) / fVar11;
            fVar9 = 1.0;
            if (fVar11 <= 1.0) {
              fVar9 = fVar11;
            }
            fVar9 = 1.0 - fVar9;
          }
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        fVar11 = 1.0;
        if (fVar15 < 1.0) {
          fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x58);
          fVar11 = 0.0;
          if (0.0 < fVar13) {
            fVar13 = (1.0 - fVar15) / fVar13;
            fVar11 = 1.0;
            if (fVar13 <= 1.0) {
              fVar11 = fVar13;
            }
            fVar11 = 1.0 - fVar11;
          }
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        fVar13 = 1.0;
        if (fVar15 < 1.0) {
          fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x54);
          fVar13 = 0.0;
          if (0.0 < fVar12) {
            fVar12 = (1.0 - fVar15) / fVar12;
            fVar13 = 1.0;
            if (fVar12 <= 1.0) {
              fVar13 = fVar12;
            }
            fVar13 = 1.0 - fVar13;
          }
        }
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar9 * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar11 * fVar15 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar13 * fVar15 + fVar14;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_HARDLIGHT:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        if (fVar15 <= 0.5) {
          fVar9 = (fVar15 + fVar15) * fVar9;
        }
        else {
          fVar9 = (1.0 - fVar15) * -2.0 * (1.0 - fVar9) + 1.0;
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        if (fVar15 <= 0.5) {
          fVar11 = (fVar15 + fVar15) * fVar11;
        }
        else {
          fVar11 = (1.0 - fVar15) * -2.0 * (1.0 - fVar11) + 1.0;
        }
        fVar15 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x54);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        if (fVar15 <= 0.5) {
          fVar13 = (fVar15 + fVar15) * fVar13;
        }
        else {
          fVar13 = (1.0 - fVar15) * -2.0 * (1.0 - fVar13) + 1.0;
        }
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar9 * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar11 * fVar15 + fVar12;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar13 * fVar15 + fVar14;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_SOFTLIGHT:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x5c);
        local_70 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x3c);
        if (fVar9 <= 0.5) {
          local_70 = local_70 - (1.0 - (fVar9 + fVar9)) * local_70 * (1.0 - local_70);
        }
        else {
          local_6c = fVar9 + fVar9 + -1.0;
          if (local_70 <= 0.25) {
            local_70 = ((local_70 * 16.0 + -12.0) * local_70 + 3.0) * local_6c * local_70 + local_70
            ;
          }
          else {
            if (local_70 < 0.0) {
              fVar9 = sqrtf(local_70);
            }
            else {
              fVar9 = SQRT(local_70);
            }
            local_70 = local_6c * (fVar9 - local_70) + local_70;
          }
        }
        local_6c = local_70 * fVar15 +
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x2c);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x58);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        if (fVar9 <= 0.5) {
          fVar11 = fVar11 - (1.0 - (fVar9 + fVar9)) * fVar11 * (1.0 - fVar11);
        }
        else {
          local_70 = fVar9 + fVar9 + -1.0;
          if (fVar11 <= 0.25) {
            fVar11 = ((fVar11 * 16.0 + -12.0) * fVar11 + 3.0) * local_70 * fVar11 + fVar11;
          }
          else {
            if (fVar11 < 0.0) {
              local_68[3] = fVar11;
              fVar9 = sqrtf(fVar11);
              fVar11 = local_68[3];
            }
            else {
              fVar9 = SQRT(fVar11);
            }
            fVar11 = local_70 * (fVar9 - fVar11) + fVar11;
          }
        }
        local_70 = fVar11 * fVar15 +
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar2 + -0x28);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x54);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        if (fVar9 <= 0.5) {
          fVar11 = fVar11 - (1.0 - (fVar9 + fVar9)) * fVar11 * (1.0 - fVar11);
        }
        else {
          fVar9 = fVar9 + fVar9 + -1.0;
          if (fVar11 <= 0.25) {
            fVar11 = ((fVar11 * 16.0 + -12.0) * fVar11 + 3.0) * fVar9 * fVar11 + fVar11;
          }
          else {
            if (fVar11 < 0.0) {
              local_68[3] = fVar9;
              local_34 = fVar11;
              fVar13 = sqrtf(fVar11);
              fVar11 = local_34;
              fVar9 = local_68[3];
            }
            else {
              fVar13 = SQRT(fVar11);
            }
            fVar11 = fVar9 * (fVar13 - fVar11) + fVar11;
          }
        }
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             local_6c;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             local_70;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar11 * fVar15 + fVar9;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_DIFFERENCE:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x3c) -
                 *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        fVar9 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar9 = fVar11;
        }
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38) -
                 *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar11 = -fVar13;
        if (-fVar13 <= fVar13) {
          fVar11 = fVar13;
        }
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34) -
                 *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x54);
        fVar12 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar12 = fVar14;
        }
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             fVar9 * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             fVar11 * fVar15 + fVar13;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             fVar12 * fVar15 + fVar14;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_EXCLUSION:
    lVar2 = 0x5c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -6) + lVar2) == '\x01')
      {
        fVar15 = *(float *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -2) + lVar2);
        fVar9 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x3c);
        fVar11 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x5c);
        fVar13 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x58);
        fVar12 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x38);
        fVar14 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x28);
        fVar8 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x54);
        fVar10 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                           lVar2 + -0x34);
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar2 + -0x24);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0xc) =
             (fVar11 * -2.0 * fVar9 + fVar11 + fVar9) * fVar15 +
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -0x2c)
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -8) =
             (fVar13 * -2.0 * fVar12 + fVar13 + fVar12) * fVar15 + fVar14;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar2 + -4) =
             (fVar8 * -2.0 * fVar10 + fVar8 + fVar10) * fVar15 + fVar1;
      }
      lVar2 = lVar2 + 0x84;
    } while (lVar2 != 0x215c);
    break;
  case BLENDEQUATION_ADVANCED_HSL_HUE:
    pVVar4 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_4c.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_4c.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        local_58.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_58.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        fVar15 = this->m_sampleRegister[lVar2].blendSrcFactorA;
        advblend::setLumSat(local_40,&local_4c,&local_58,&local_58);
        local_68[2] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        lVar3 = 0;
        do {
          local_68[lVar3] = *(float *)(local_40 + lVar3 * 4) * fVar15;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_78 = 0.0;
        local_80 = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_80 + lVar3 * 4) = local_68[lVar3] + pVVar4->m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendedRGB.m_data[2] = local_78;
        *(undefined8 *)this->m_sampleRegister[lVar2].blendedRGB.m_data = local_80;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pVVar4 + 0xb;
    } while (lVar2 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_SATURATION:
    pVVar4 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_4c.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_4c.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        local_58.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_58.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        fVar15 = this->m_sampleRegister[lVar2].blendSrcFactorA;
        advblend::setLumSat(local_40,&local_58,&local_4c,&local_58);
        local_68[2] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        lVar3 = 0;
        do {
          local_68[lVar3] = *(float *)(local_40 + lVar3 * 4) * fVar15;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_78 = 0.0;
        local_80 = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_80 + lVar3 * 4) = local_68[lVar3] + pVVar4->m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendedRGB.m_data[2] = local_78;
        *(undefined8 *)this->m_sampleRegister[lVar2].blendedRGB.m_data = local_80;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pVVar4 + 0xb;
    } while (lVar2 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_COLOR:
    pVVar4 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_4c.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_4c.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        local_58.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_58.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        fVar15 = this->m_sampleRegister[lVar2].blendSrcFactorA;
        advblend::setLum(&local_4c,&local_58);
        local_68[2] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        lVar3 = 0;
        do {
          local_68[lVar3] = *(float *)(local_40 + lVar3 * 4) * fVar15;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_78 = 0.0;
        local_80 = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_80 + lVar3 * 4) = local_68[lVar3] + pVVar4->m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendedRGB.m_data[2] = local_78;
        *(undefined8 *)this->m_sampleRegister[lVar2].blendedRGB.m_data = local_80;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pVVar4 + 0xb;
    } while (lVar2 != 0x40);
    break;
  case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:
    pVVar4 = &this->m_sampleRegister[0].blendSrcFactorRGB;
    lVar2 = 0;
    do {
      if (this->m_sampleRegister[lVar2].isAlive == true) {
        local_4c.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data;
        local_4c.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendSrcColor.m_data[2];
        local_58.m_data._0_8_ =
             *(undefined8 *)this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data;
        local_58.m_data[2] = this->m_sampleRegister[lVar2].clampedBlendDstColor.m_data[2];
        fVar15 = this->m_sampleRegister[lVar2].blendSrcFactorA;
        advblend::setLum(&local_58,&local_4c);
        local_68[2] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        lVar3 = 0;
        do {
          local_68[lVar3] = *(float *)(local_40 + lVar3 * 4) * fVar15;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_78 = 0.0;
        local_80 = 0;
        lVar3 = 0;
        do {
          *(float *)((long)&local_80 + lVar3 * 4) = local_68[lVar3] + pVVar4->m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        this->m_sampleRegister[lVar2].blendedRGB.m_data[2] = local_78;
        *(undefined8 *)this->m_sampleRegister[lVar2].blendedRGB.m_data = local_80;
      }
      lVar2 = lVar2 + 1;
      pVVar4 = pVVar4 + 0xb;
    } while (lVar2 != 0x40);
  }
  return;
}

Assistant:

void FragmentProcessor::executeAdvancedBlend (BlendEquationAdvanced equation)
{
	using namespace advblend;

#define SAMPLE_REGISTER_ADV_BLEND(FUNCTION_NAME)											\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;							\
			const Vec4&	dstColor	= sample.clampedBlendDstColor;							\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
			const float	r			= FUNCTION_NAME(srcColor[0], dstColor[0])*p0 + bias[0];	\
			const float	g			= FUNCTION_NAME(srcColor[1], dstColor[1])*p0 + bias[1];	\
			const float	b			= FUNCTION_NAME(srcColor[2], dstColor[2])*p0 + bias[2];	\
																							\
			sample.blendedRGB = Vec3(r, g, b);												\
		}																					\
	}

#define SAMPLE_REGISTER_ADV_BLEND_HSL(COLOR_EXPRESSION)										\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)			\
	{																						\
		if (m_sampleRegister[regSampleNdx].isAlive)											\
		{																					\
			SampleData&	sample		= m_sampleRegister[regSampleNdx];						\
			const Vec3	srcColor	= sample.clampedBlendSrcColor.swizzle(0,1,2);			\
			const Vec3	dstColor	= sample.clampedBlendDstColor.swizzle(0,1,2);			\
			const Vec3&	bias		= sample.blendSrcFactorRGB;								\
			const float	p0			= sample.blendSrcFactorA;								\
																							\
			sample.blendedRGB = (COLOR_EXPRESSION)*p0 + bias;								\
		}																					\
	}

	// Pre-compute factors & compute alpha \todo [2014-03-18 pyry] Re-using variable names.
	// \note clampedBlend*Color contains clamped & unpremultiplied colors
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			SampleData&	sample		= m_sampleRegister[regSampleNdx];
			const Vec4&	srcColor	= sample.clampedBlendSrcColor;
			const Vec4&	dstColor	= sample.clampedBlendDstColor;
			const float	srcA		= srcColor.w();
			const float	dstA		= dstColor.w();
			const float	p0			= srcA*dstA;
			const float p1			= srcA*(1.0f-dstA);
			const float p2			= dstA*(1.0f-srcA);
			const Vec3	bias		(srcColor[0]*p1 + dstColor[0]*p2,
									 srcColor[1]*p1 + dstColor[1]*p2,
									 srcColor[2]*p1 + dstColor[2]*p2);

			sample.blendSrcFactorRGB	= bias;
			sample.blendSrcFactorA		= p0;
			sample.blendedA				= p0 + p1 + p2;
		}
	}

	switch (equation)
	{
		case BLENDEQUATION_ADVANCED_MULTIPLY:		SAMPLE_REGISTER_ADV_BLEND(multiply);									break;
		case BLENDEQUATION_ADVANCED_SCREEN:			SAMPLE_REGISTER_ADV_BLEND(screen);										break;
		case BLENDEQUATION_ADVANCED_OVERLAY:		SAMPLE_REGISTER_ADV_BLEND(overlay);										break;
		case BLENDEQUATION_ADVANCED_DARKEN:			SAMPLE_REGISTER_ADV_BLEND(darken);										break;
		case BLENDEQUATION_ADVANCED_LIGHTEN:		SAMPLE_REGISTER_ADV_BLEND(lighten);										break;
		case BLENDEQUATION_ADVANCED_COLORDODGE:		SAMPLE_REGISTER_ADV_BLEND(colordodge);									break;
		case BLENDEQUATION_ADVANCED_COLORBURN:		SAMPLE_REGISTER_ADV_BLEND(colorburn);									break;
		case BLENDEQUATION_ADVANCED_HARDLIGHT:		SAMPLE_REGISTER_ADV_BLEND(hardlight);									break;
		case BLENDEQUATION_ADVANCED_SOFTLIGHT:		SAMPLE_REGISTER_ADV_BLEND(softlight);									break;
		case BLENDEQUATION_ADVANCED_DIFFERENCE:		SAMPLE_REGISTER_ADV_BLEND(difference);									break;
		case BLENDEQUATION_ADVANCED_EXCLUSION:		SAMPLE_REGISTER_ADV_BLEND(exclusion);									break;
		case BLENDEQUATION_ADVANCED_HSL_HUE:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(srcColor, dstColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_SATURATION:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLumSat(dstColor, srcColor, dstColor));	break;
		case BLENDEQUATION_ADVANCED_HSL_COLOR:		SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(srcColor, dstColor));				break;
		case BLENDEQUATION_ADVANCED_HSL_LUMINOSITY:	SAMPLE_REGISTER_ADV_BLEND_HSL(setLum(dstColor, srcColor));				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_ADV_BLEND
#undef SAMPLE_REGISTER_ADV_BLEND_HSL
}